

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

Datatype * __thiscall TypeFactory::getBase(TypeFactory *this,int4 s,type_metatype m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypeArray *ct;
  Datatype *pDVar2;
  TypeBase tmp;
  Datatype local_58;
  
  if (s < 9) {
    if ((int)m < 3) goto LAB_00274dab;
    pDVar2 = this->typecache[s][m - TYPE_FLOAT];
  }
  else {
    if (m != TYPE_FLOAT) goto LAB_00274dab;
    if (s == 0x10) {
      pDVar2 = this->typecache16;
    }
    else if (s == 10) {
      pDVar2 = this->typecache10;
    }
    else {
      pDVar2 = (Datatype *)0x0;
    }
  }
  if (pDVar2 != (Datatype *)0x0) {
    return pDVar2;
  }
LAB_00274dab:
  if (s <= this->glb->max_basetype_size) {
    paVar1 = &local_58.name.field_2;
    local_58.name._M_string_length = 0;
    local_58.name.field_2._M_local_buf[0] = '\0';
    local_58.flags = 0;
    local_58.id = 0;
    local_58._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c3268;
    local_58.size = s;
    local_58.name._M_dataplus._M_p = (pointer)paVar1;
    local_58.metatype = m;
    pDVar2 = findAdd(this,&local_58);
    local_58._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c2eb8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.name._M_dataplus._M_p);
    }
    return pDVar2;
  }
  ct = getTypeArray(this,s,this->typecache[1][5]);
  pDVar2 = findAdd(this,&ct->super_Datatype);
  return pDVar2;
}

Assistant:

Datatype *TypeFactory::getBase(int4 s,type_metatype m)

{
  Datatype *ct;
  if (s<9) {
    if (m >= TYPE_FLOAT) {
      ct = typecache[s][m-TYPE_FLOAT];
      if (ct != (Datatype *)0)
	return ct;
    }
  }
  else if (m==TYPE_FLOAT) {
    if (s==10)
      ct = typecache10;
    else if (s==16)
      ct = typecache16;
    else
      ct = (Datatype *)0;
    if (ct != (Datatype *)0)
      return ct;
  }
  if (s > glb->max_basetype_size) {
    // Create array of unknown bytes to match size
    ct = typecache[1][TYPE_UNKNOWN-TYPE_FLOAT];
    ct = getTypeArray(s,ct);
    return findAdd(*ct);
  }
  TypeBase tmp(s,m);
  return findAdd(tmp);
}